

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyTest(void)

{
  Scl_Tree_t *p;
  Vec_Str_t *vStr;
  
  p = Scl_LibertyParse("bwrc.lib",0);
  if (p != (Scl_Tree_t *)0x0) {
    vStr = Scl_LibertyReadSclStr(p,1,0);
    Scl_LibertyStringDump("test_scl.lib",vStr);
    Vec_StrFree(vStr);
    Scl_LibertyStop(p,1);
    return;
  }
  return;
}

Assistant:

void Scl_LibertyTest()
{
    char * pFileName = "bwrc.lib";
    int fVerbose = 1;
    int fVeryVerbose = 0;
    Scl_Tree_t * p;
    Vec_Str_t * vStr;
//    return;
    p = Scl_LibertyParse( pFileName, fVeryVerbose );
    if ( p == NULL )
        return;
//    Scl_LibertyParseDump( p, "temp_.lib" );
    vStr = Scl_LibertyReadSclStr( p, fVerbose, fVeryVerbose );
    Scl_LibertyStringDump( "test_scl.lib", vStr );
    Vec_StrFree( vStr );
    Scl_LibertyStop( p, fVerbose );
}